

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::vector<unsigned_char>::increase_capacity
          (vector<unsigned_char> *this,uint32 min_new_capacity,bool grow_hint)

{
  bool bVar1;
  bool grow_hint_local;
  uint32 min_new_capacity_local;
  vector<unsigned_char> *this_local;
  
  bVar1 = elemental_vector::increase_capacity
                    ((elemental_vector *)this,min_new_capacity,grow_hint,1,(object_mover)0x0);
  if (!bVar1) {
    this->m_alloc_failed = true;
  }
  return bVar1;
}

Assistant:

inline bool increase_capacity(uint32 min_new_capacity, bool grow_hint)
        {
            if (!reinterpret_cast<elemental_vector*>(this)->increase_capacity(
                min_new_capacity, grow_hint, sizeof(T),
                ((scalar_type<T>::cFlag) || (is_vector<T>::cFlag) || (bitwise_movable<T>::cFlag) || CRND_IS_POD(T)) ? NULL : object_mover))
            {
                m_alloc_failed = true;
                return false;
            }
            return true;
        }